

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::
iuConcatParamHolder<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>_>
::params_t<int>::append<bool>(params_t<int> *this,iuParamGenerator<bool> *gen)

{
  bool bVar1;
  uint local_1c;
  iuParamGenerator<bool> *local_18;
  iuParamGenerator<bool> *gen_local;
  params_t<int> *this_local;
  
  local_18 = gen;
  gen_local = (iuParamGenerator<bool> *)this;
  iuParamGenerator<bool>::Begin(gen);
  while( true ) {
    bVar1 = iuParamGenerator<bool>::IsEnd(local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = iuParamGenerator<bool>::GetCurrent(local_18);
    local_1c = (uint)bVar1;
    std::vector<int,_std::allocator<int>_>::push_back(&this->val,(value_type_conflict3 *)&local_1c);
    iuParamGenerator<bool>::Next(local_18);
  }
  return;
}

Assistant:

void append(iuParamGenerator<U>& gen)
        {
            for( gen.Begin(); !gen.IsEnd(); gen.Next() )
            {
                val.push_back(static_cast<T>(gen.GetCurrent()));
            }
        }